

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringencode.cc
# Opt level: O2

size_t rtc::html_decode(char *buffer,size_t buflen,char *source,size_t srclen)

{
  size_t sVar1;
  ostream *poVar2;
  FatalMessage local_180;
  
  if (buffer != (char *)0x0) {
    sVar1 = xml_decode(buffer,buflen,source,srclen);
    return sVar1;
  }
  FatalMessage::FatalMessage
            (&local_180,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/stringencode.cc"
             ,0x139);
  poVar2 = std::operator<<((ostream *)&local_180,"Check failed: buffer");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<(poVar2,"# ");
  FatalMessage::~FatalMessage(&local_180);
}

Assistant:

size_t html_decode(char * buffer, size_t buflen,
                   const char * source, size_t srclen) {
  RTC_DCHECK(buffer);  // TODO(grunell): estimate output size
  return xml_decode(buffer, buflen, source, srclen);
}